

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O2

void __thiscall
pbrt::UniformGridMediumProvider::UniformGridMediumProvider
          (UniformGridMediumProvider *this,Bounds3f *bounds,
          optional<pbrt::SampledGrid<float>_> *dgrid,
          optional<pbrt::SampledGrid<pbrt::RGB>_> *rgbgrid,RGBColorSpace *colorSpace,
          SpectrumHandle *Le,SampledGrid<float> *Legrid,Allocator alloc)

{
  undefined8 uVar1;
  float fVar2;
  SampledGrid<float> *pSVar3;
  long lVar4;
  SampledGrid<pbrt::RGB> *pSVar5;
  long in_FS_OFFSET;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_38;
  
  fVar2 = (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
  (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y =
       (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
  (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar2;
  fVar2 = (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
  uVar1 = *(undefined8 *)&(bounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
  (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x =
       (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
  (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar2;
  *(undefined8 *)&(this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar1;
  pstd::optional<pbrt::SampledGrid<float>_>::optional(&this->densityGrid,dgrid);
  pstd::optional<pbrt::SampledGrid<pbrt::RGB>_>::optional(&this->rgbDensityGrid,rgbgrid);
  this->colorSpace = colorSpace;
  local_38.bits =
       (Le->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  DenselySampledSpectrum::DenselySampledSpectrum(&this->Le_spec,(SpectrumHandle *)&local_38,alloc);
  SampledGrid<float>::SampledGrid(&this->LeScaleGrid,Legrid);
  *(long *)(in_FS_OFFSET + -0x1e0) =
       *(long *)(in_FS_OFFSET + -0x1e0) + (this->LeScaleGrid).values.nStored * 4;
  if ((this->densityGrid).set == true) {
    pSVar3 = pstd::optional<pbrt::SampledGrid<float>_>::value(&this->densityGrid);
    lVar4 = (pSVar3->values).nStored << 2;
  }
  else {
    pSVar5 = pstd::optional<pbrt::SampledGrid<pbrt::RGB>_>::value(&this->rgbDensityGrid);
    lVar4 = (pSVar5->values).nStored * 0xc;
  }
  *(long *)(in_FS_OFFSET + -0x1e0) = *(long *)(in_FS_OFFSET + -0x1e0) + lVar4;
  return;
}

Assistant:

UniformGridMediumProvider::UniformGridMediumProvider(
    const Bounds3f &bounds, pstd::optional<SampledGrid<Float>> dgrid,
    pstd::optional<SampledGrid<RGB>> rgbgrid, const RGBColorSpace *colorSpace,
    SpectrumHandle Le, SampledGrid<Float> Legrid, Allocator alloc)
    : bounds(bounds),
      densityGrid(std::move(dgrid)),
      rgbDensityGrid(std::move(rgbgrid)),
      colorSpace(colorSpace),
      Le_spec(Le, alloc),
      LeScaleGrid(std::move(Legrid)) {
    volumeGridBytes += LeScaleGrid.BytesAllocated();
    volumeGridBytes +=
        densityGrid ? densityGrid->BytesAllocated() : rgbDensityGrid->BytesAllocated();
}